

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NtkEliminateSpecial(Abc_Ntk_t *pNtk,int nMaxSize,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar7;
  int *pPermFanin_00;
  int *pPermFanout_00;
  Vec_Ptr_t *vFanins_00;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pNodeNew;
  int local_60;
  int k;
  int i;
  int RetValue;
  int *pPermFanout;
  int *pPermFanin;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vFanins;
  Vec_Ptr_t *vFanouts;
  int fVerbose_local;
  int nMaxSize_local;
  Abc_Ntk_t *pNtk_local;
  
  if (nMaxSize < 1) {
    __assert_fail("nMaxSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                  ,0x2db,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                  ,0x2dc,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkToBdd(pNtk);
  if (iVar1 == 0) {
    fprintf(_stdout,"Converting to BDD has failed.\n");
    pNtk_local._4_4_ = 0;
  }
  else {
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    Abc_NtkCleanup(pNtk,0);
    iVar1 = Abc_NtkToSop(pNtk,-1,1000000000);
    if (iVar1 == 0) {
      fprintf(_stdout,"Converting to SOP has failed.\n");
      pNtk_local._4_4_ = 0;
    }
    else {
      p = Vec_PtrAlloc(1000);
      for (local_60 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_60 < iVar1; local_60 = local_60 + 1
          ) {
        pAVar7 = Abc_NtkObj(pNtk,local_60);
        if (((pAVar7 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar7), iVar1 != 0)) &&
           (iVar1 = Abc_ObjFanoutNum(pAVar7), iVar1 == 1)) {
          pAVar8 = Abc_ObjFanout0(pAVar7);
          iVar1 = Abc_ObjIsNode(pAVar8);
          if (((iVar1 != 0) &&
              (iVar1 = Abc_SopGetCubeNum((char *)(pAVar7->field_5).pData), iVar1 == 1)) &&
             (iVar1 = Abc_SopGetCubeNum((char *)(pAVar8->field_5).pData), iVar1 == 1)) {
            iVar1 = Abc_NodeFindFanin(pAVar8,pAVar7);
            if ((iVar1 < 0) || (iVar2 = Abc_ObjFaninNum(pAVar8), iVar2 <= iVar1)) {
              __assert_fail("RetValue >= 0 && RetValue < Abc_ObjFaninNum(pFanout)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                            ,0x301,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
            }
            iVar2 = Abc_SopIsComplement((char *)(pAVar7->field_5).pData);
            iVar1 = Abc_SopGetIthCareLit((char *)(pAVar8->field_5).pData,iVar1);
            if (iVar2 != iVar1) {
              Vec_PtrPush(p,pAVar7);
            }
          }
        }
      }
      iVar1 = Vec_PtrSize(p);
      if (iVar1 == 0) {
        Vec_PtrFree(p);
        pNtk_local._4_4_ = 1;
      }
      else {
        Abc_ObjSortInReverseOrder(pNtk,p);
        iVar1 = Abc_NtkToBdd(pNtk);
        if (iVar1 == 0) {
          fprintf(_stdout,"Converting to BDD has failed.\n");
          pNtk_local._4_4_ = 0;
        }
        else {
          pPermFanin_00 = (int *)malloc((long)(nMaxSize + 1000) << 2);
          pPermFanout_00 = (int *)malloc((long)(nMaxSize + 1000) << 2);
          vFanins_00 = Vec_PtrAlloc(1000);
          vNodes_00 = Vec_PtrAlloc(1000);
          for (local_60 = 0; iVar1 = Vec_PtrSize(p), local_60 < iVar1; local_60 = local_60 + 1) {
            pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p,local_60);
            iVar1 = Abc_ObjIsNode(pAVar7);
            if (iVar1 == 0) {
              __assert_fail("Abc_ObjIsNode(pNode)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                            ,0x31c,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
            }
            pAVar8 = Abc_NodeFindCoFanout(pAVar7);
            if (pAVar8 != (Abc_Obj_t *)0x0) {
              __assert_fail("Abc_NodeFindCoFanout(pNode) == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                            ,0x31d,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
            }
            Abc_NodeCollectFanouts(pAVar7,vNodes_00);
            for (pNodeNew._4_4_ = 0; iVar1 = Vec_PtrSize(vNodes_00), pNodeNew._4_4_ < iVar1;
                pNodeNew._4_4_ = pNodeNew._4_4_ + 1) {
              pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,pNodeNew._4_4_);
              if (fVerbose != 0) {
                uVar3 = Abc_ObjId(pAVar7);
                uVar4 = Abc_ObjFaninNum(pAVar7);
                uVar5 = Abc_ObjId(pAVar8);
                uVar6 = Abc_ObjFaninNum(pAVar8);
                printf("Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",(ulong)uVar3,
                       (ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
              }
              iVar1 = Abc_NodeCollapse(pAVar7,pAVar8,vFanins_00,pPermFanin_00,pPermFanout_00);
              if (iVar1 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                              ,0x326,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
              }
              if (fVerbose != 0) {
                iVar1 = Abc_NtkObjNumMax(pNtk);
                pAVar8 = Abc_NtkObj(pNtk,iVar1 + -1);
                if (pAVar8 != (Abc_Obj_t *)0x0) {
                  uVar3 = Abc_ObjId(pAVar8);
                  uVar4 = Abc_ObjFaninNum(pAVar8);
                  printf("resulting in node %5d (supp =%2d).\n",(ulong)uVar3,(ulong)uVar4);
                }
              }
            }
          }
          Abc_NtkBddReorder(pNtk,0);
          Vec_PtrFree(vFanins_00);
          Vec_PtrFree(vNodes_00);
          Vec_PtrFree(p);
          if (pPermFanin_00 != (int *)0x0) {
            free(pPermFanin_00);
          }
          if (pPermFanout_00 != (int *)0x0) {
            free(pPermFanout_00);
          }
          pNtk_local._4_4_ = 1;
        }
      }
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkEliminateSpecial( Abc_Ntk_t * pNtk, int nMaxSize, int fVerbose )
{
    extern void Abc_NtkBddReorder( Abc_Ntk_t * pNtk, int fVerbose );
    Vec_Ptr_t * vFanouts, * vFanins, * vNodes;
    Abc_Obj_t * pNode, * pFanout;
    int * pPermFanin, * pPermFanout;
    int RetValue, i, k;
    assert( nMaxSize > 0 );
    assert( Abc_NtkIsLogic(pNtk) ); 


    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }

    // prepare nodes for sweeping
    Abc_NtkRemoveDupFanins( pNtk );
    Abc_NtkMinimumBase( pNtk );
    Abc_NtkCleanup( pNtk, 0 );

    // convert network to SOPs
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        fprintf( stdout, "Converting to SOP has failed.\n" );
        return 0;
    }

    // collect info about the nodes to be eliminated
    vNodes = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjFanoutNum(pNode) != 1 )
            continue;
        pFanout = Abc_ObjFanout0(pNode);
        if ( !Abc_ObjIsNode(pFanout) )
            continue;
        if ( Abc_SopGetCubeNum((char *)pNode->pData) != 1 )
            continue;
        if ( Abc_SopGetCubeNum((char *)pFanout->pData) != 1 )
            continue;
        // find the fanout's fanin
        RetValue = Abc_NodeFindFanin( pFanout, pNode );
        assert( RetValue >= 0 && RetValue < Abc_ObjFaninNum(pFanout) );
        // both pNode and pFanout are AND/OR type nodes
        if ( Abc_SopIsComplement((char *)pNode->pData) == Abc_SopGetIthCareLit((char *)pFanout->pData, RetValue) )
            continue;
        Vec_PtrPush( vNodes, pNode );
    }
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrFree( vNodes );
        return 1;
    }
    Abc_ObjSortInReverseOrder( pNtk, vNodes );

    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }

    // go through the nodes and decide is they can be eliminated
    pPermFanin = ABC_ALLOC( int, nMaxSize + 1000 );
    pPermFanout = ABC_ALLOC( int, nMaxSize + 1000 );
    vFanins = Vec_PtrAlloc( 1000 );
    vFanouts = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        assert( Abc_ObjIsNode(pNode) );
        assert( Abc_NodeFindCoFanout(pNode) == NULL );
        // perform elimination
        Abc_NodeCollectFanouts( pNode, vFanouts );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, k )
        {
            if ( fVerbose )
                printf( "Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                    Abc_ObjId(pNode), Abc_ObjFaninNum(pNode), Abc_ObjId(pFanout), Abc_ObjFaninNum(pFanout) ); 
            RetValue = Abc_NodeCollapse( pNode, pFanout, vFanins, pPermFanin, pPermFanout );
            assert( RetValue );
            if ( fVerbose )
            {
                Abc_Obj_t * pNodeNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk) - 1 );
                if ( pNodeNew )
                    printf( "resulting in node %5d (supp =%2d).\n", Abc_ObjId(pNodeNew), Abc_ObjFaninNum(pNodeNew) );
            }
        }
    }
    Abc_NtkBddReorder( pNtk, 0 );
    Vec_PtrFree( vFanins );
    Vec_PtrFree( vFanouts );
    Vec_PtrFree( vNodes );
    ABC_FREE( pPermFanin );
    ABC_FREE( pPermFanout );
    return 1;
}